

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_test.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  TestRange<bool> *in_stack_00000078;
  _func_int_bool *in_stack_00000080;
  string *in_stack_00000088;
  TestSuite *in_stack_00000090;
  TestRange<unsigned_long> *in_stack_00000098;
  _func_int_unsigned_long *in_stack_000000a0;
  string *in_stack_000000a8;
  TestSuite *in_stack_000000b0;
  TestSuite ts;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe18;
  TestRange<unsigned_long> *in_stack_fffffffffffffe20;
  TestRange<bool> *this;
  char **in_stack_fffffffffffffe30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined8 in_stack_fffffffffffffe38;
  allocator *paVar1;
  undefined6 in_stack_fffffffffffffe40;
  allocator_type in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  allocator_type *in_stack_fffffffffffffe48;
  allocator_type *__a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe50;
  vector<bool,_std::allocator<bool>_> *this_01;
  initializer_list<bool> in_stack_fffffffffffffe58;
  TestSuite *in_stack_fffffffffffffe70;
  allocator local_141;
  string local_140 [39];
  undefined1 local_119 [25];
  undefined1 *local_100;
  undefined8 local_f8;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68;
  int local_4;
  
  local_4 = 0;
  TestSuite::TestSuite
            ((TestSuite *)
             CONCAT17(in_stack_fffffffffffffe47,
                      CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
             (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30);
  local_68 = 0;
  paVar1 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"buffer basic test",paVar1);
  local_119._1_8_ = 0x400;
  local_119._9_8_ = 0x8000;
  local_119._17_8_ = 0x10000;
  local_100 = local_119 + 1;
  local_f8 = 3;
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_119;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x10f9db);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe50,(initializer_list<unsigned_long>)in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe48);
  TestRange<unsigned_long>::TestRange
            (in_stack_fffffffffffffe20,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe18);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  TestRange<unsigned_long>::~TestRange((TestRange<unsigned_long> *)0x10fa49);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10fa63);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"buffer serializer test",&local_141);
  __a = (allocator_type *)&stack0xfffffffffffffe46;
  this_01 = (vector<bool,_std::allocator<bool>_> *)0x2;
  this = (TestRange<bool> *)&stack0xfffffffffffffe45;
  std::allocator<bool>::allocator((allocator<bool> *)0x10fad6);
  std::vector<bool,_std::allocator<bool>_>::vector(this_01,in_stack_fffffffffffffe58,__a);
  TestRange<bool>::TestRange(this,in_stack_fffffffffffffe18);
  TestSuite::doTest<bool,int(*)(bool)>
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  TestRange<bool>::~TestRange((TestRange<bool> *)0x10fb2f);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10fb39)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x10fb43);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  local_4 = 0;
  TestSuite::~TestSuite(in_stack_fffffffffffffe70);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite ts(argc, argv);

    ts.options.printTestMessage = false;

    ts.doTest( "buffer basic test",
               buffer_basic_test,
               TestRange<size_t>( {1024, 0x8000, 0x10000} ) );

    ts.doTest( "buffer serializer test",
               buffer_serializer_test,
               TestRange<bool>( {true, false} ) );

    return 0;
}